

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O3

void __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::Destroy(OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
          *this)

{
  _Base_ptr p_Var1;
  
  if (this->free_type == REQUIRES_FREE) {
    for (p_Var1 = (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->map)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
      if ((this->free_type == REQUIRES_FREE) && (0xc < (ulong)p_Var1[1]._M_color)) {
        Allocator::FreeData(this->allocator,(data_ptr_t)p_Var1[1]._M_parent,
                            (ulong)p_Var1[1]._M_color);
      }
    }
  }
  ::std::
  _Rb_tree<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_long>,_std::_Select1st<std::pair<const_duckdb::string_t,_unsigned_long>_>,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>
  ::clear(&(this->map)._M_t);
  return;
}

Assistant:

void Destroy() {
		if (free_type == AllocatorFreeType::REQUIRES_FREE) {
			for (auto &str : map) {
				DestroyString(str.first);
			}
		}
		map.clear();
	}